

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O2

void ovf::detail::parse::v2::ovf_segment_header_action<ovf::detail::parse::v2::keyword_value_line>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  parse_error *ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  parser_state *ppVar7;
  char **ppcVar8;
  float fVar9;
  string meshtype;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_31;
  
  bVar2 = std::operator==(&f->_state->keyword,"title");
  ppVar7 = f->_state;
  if (bVar2) {
    pcVar4 = strdup((ppVar7->value)._M_dataplus._M_p);
    segment->title = pcVar4;
    ppVar7->found_title = true;
  }
  else {
    bVar2 = std::operator==(&ppVar7->keyword,"desc");
    ppVar7 = f->_state;
    if (bVar2) {
      pcVar4 = strdup((ppVar7->value)._M_dataplus._M_p);
      segment->comment = pcVar4;
    }
    else {
      bVar2 = std::operator==(&ppVar7->keyword,"meshunit");
      ppVar7 = f->_state;
      if (bVar2) {
        pcVar4 = strdup((ppVar7->value)._M_dataplus._M_p);
        segment->meshunit = pcVar4;
        ppVar7->found_meshunit = true;
      }
      else {
        bVar2 = std::operator==(&ppVar7->keyword,"valuedim");
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,(allocator *)&local_58)
          ;
          iVar3 = std::__cxx11::stoi(&meshtype,(size_t *)0x0,10);
          segment->valuedim = iVar3;
          std::__cxx11::string::~string((string *)&meshtype);
          ppVar7 = f->_state;
          ppVar7->found_valuedim = true;
        }
        else {
          bVar2 = std::operator==(&f->_state->keyword,"valueunits");
          ppVar7 = f->_state;
          if (bVar2) {
            pcVar4 = strdup((ppVar7->value)._M_dataplus._M_p);
            segment->valueunits = pcVar4;
            ppVar7->found_valueunits = true;
          }
          else {
            bVar2 = std::operator==(&ppVar7->keyword,"valuelabels");
            ppVar7 = f->_state;
            if (bVar2) {
              pcVar4 = strdup((ppVar7->value)._M_dataplus._M_p);
              segment->valuelabels = pcVar4;
              ppVar7->found_valuelabels = true;
            }
            else {
              bVar2 = std::operator==(&ppVar7->keyword,"xmin");
              if (bVar2) {
                std::__cxx11::string::string
                          ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                           (allocator *)&local_58);
                fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                segment->bounds_min[0] = fVar9;
                std::__cxx11::string::~string((string *)&meshtype);
                ppVar7 = f->_state;
                ppVar7->found_xmin = true;
              }
              else {
                bVar2 = std::operator==(&f->_state->keyword,"ymin");
                if (bVar2) {
                  std::__cxx11::string::string
                            ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                             (allocator *)&local_58);
                  fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                  segment->bounds_min[1] = fVar9;
                  std::__cxx11::string::~string((string *)&meshtype);
                  ppVar7 = f->_state;
                  ppVar7->found_ymin = true;
                }
                else {
                  bVar2 = std::operator==(&f->_state->keyword,"zmin");
                  if (bVar2) {
                    std::__cxx11::string::string
                              ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                               (allocator *)&local_58);
                    fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                    segment->bounds_min[2] = fVar9;
                    std::__cxx11::string::~string((string *)&meshtype);
                    ppVar7 = f->_state;
                    ppVar7->found_zmin = true;
                  }
                  else {
                    bVar2 = std::operator==(&f->_state->keyword,"xmax");
                    if (bVar2) {
                      std::__cxx11::string::string
                                ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                                 (allocator *)&local_58);
                      fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                      segment->bounds_max[0] = fVar9;
                      std::__cxx11::string::~string((string *)&meshtype);
                      ppVar7 = f->_state;
                      ppVar7->found_xmax = true;
                    }
                    else {
                      bVar2 = std::operator==(&f->_state->keyword,"ymax");
                      if (bVar2) {
                        std::__cxx11::string::string
                                  ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                                   (allocator *)&local_58);
                        fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                        segment->bounds_max[1] = fVar9;
                        std::__cxx11::string::~string((string *)&meshtype);
                        ppVar7 = f->_state;
                        ppVar7->found_ymax = true;
                      }
                      else {
                        bVar2 = std::operator==(&f->_state->keyword,"zmax");
                        if (bVar2) {
                          std::__cxx11::string::string
                                    ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                                     (allocator *)&local_58);
                          fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                          segment->bounds_max[2] = fVar9;
                          std::__cxx11::string::~string((string *)&meshtype);
                          ppVar7 = f->_state;
                          ppVar7->found_zmax = true;
                        }
                        else {
                          bVar2 = std::operator==(&f->_state->keyword,"meshtype");
                          if (bVar2) {
                            std::__cxx11::string::string
                                      ((string *)&meshtype,(string *)&f->_state->value);
                            _Var1 = meshtype._M_dataplus;
                            for (sVar6 = 0; meshtype._M_string_length != sVar6; sVar6 = sVar6 + 1) {
                              iVar3 = tolower((int)_Var1._M_p[sVar6]);
                              _Var1._M_p[sVar6] = (char)iVar3;
                            }
                            std::__cxx11::string::string
                                      ((string *)&local_58,segment->meshtype,&local_59);
                            ppcVar8 = &segment->meshtype;
                            bVar2 = std::operator==(&local_58,"");
                            std::__cxx11::string::~string((string *)&local_58);
                            if (bVar2) {
                              bVar2 = std::operator!=(&meshtype,"rectangular");
                              if (bVar2) {
                                bVar2 = std::operator!=(&meshtype,"irregular");
                                if (bVar2) {
                                  ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                  fmt::v5::format<char[23],std::__cxx11::string>
                                            (&local_58,(v5 *)"Invalid meshtype: \"{}\"",
                                             (char (*) [23])&meshtype,in_RCX);
                                  tao::pegtl::parse_error::
                                  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                            (ppVar5,&local_58,in);
                                  __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                              tao::pegtl::parse_error::~parse_error);
                                }
                              }
                              pcVar4 = strdup(meshtype._M_dataplus._M_p);
                              *ppcVar8 = pcVar4;
                            }
                            else {
                              std::__cxx11::string::string((string *)&local_58,*ppcVar8,&local_59);
                              bVar2 = std::operator!=(&local_58,&meshtype);
                              std::__cxx11::string::~string((string *)&local_58);
                              if (bVar2) {
                                ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                fmt::v5::format<char[94],std::__cxx11::string,char*>
                                          (&local_58,
                                           (v5 *)
                                           "meshtype \"{}\" was specified, but due to other parameters specified before, \"{}\" was expected!"
                                           ,(char (*) [94])&meshtype,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)ppcVar8,(char **)in_R8);
                                tao::pegtl::parse_error::
                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                          (ppVar5,&local_58,in);
                                __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                            tao::pegtl::parse_error::~parse_error);
                              }
                            }
                            f->_state->found_meshtype = true;
                            std::__cxx11::string::~string((string *)&meshtype);
                            ppVar7 = f->_state;
                          }
                          else {
                            bVar2 = std::operator==(&f->_state->keyword,"xbase");
                            if (bVar2) {
                              std::__cxx11::string::string
                                        ((string *)&meshtype,segment->meshtype,
                                         (allocator *)&local_58);
                              bVar2 = std::operator!=(&meshtype,"rectangular");
                              std::__cxx11::string::~string((string *)&meshtype);
                              if (bVar2) {
                                ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                fmt::v5::format<char[56],char*>
                                          (&meshtype,
                                           (v5 *)
                                           "xbase is only for rectangular meshes! Mesh type is \"{}\""
                                           ,(char (*) [56])&segment->meshtype,(char **)in_RCX);
                                tao::pegtl::parse_error::
                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                          (ppVar5,&meshtype,in);
                                __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                            tao::pegtl::parse_error::~parse_error);
                              }
                              pcVar4 = strdup("rectangular");
                              segment->meshtype = pcVar4;
                              std::__cxx11::string::string
                                        ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                                         (allocator *)&local_58);
                              fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                              segment->origin[0] = fVar9;
                              std::__cxx11::string::~string((string *)&meshtype);
                              ppVar7 = f->_state;
                              ppVar7->found_xbase = true;
                            }
                            else {
                              bVar2 = std::operator==(&f->_state->keyword,"ybase");
                              if (bVar2) {
                                std::__cxx11::string::string
                                          ((string *)&meshtype,segment->meshtype,
                                           (allocator *)&local_58);
                                bVar2 = std::operator!=(&meshtype,"rectangular");
                                std::__cxx11::string::~string((string *)&meshtype);
                                if (bVar2) {
                                  ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                  fmt::v5::format<char[56],char*>
                                            (&meshtype,
                                             (v5 *)
                                             "ybase is only for rectangular meshes! Mesh type is \"{}\""
                                             ,(char (*) [56])&segment->meshtype,(char **)in_RCX);
                                  tao::pegtl::parse_error::
                                  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                            (ppVar5,&meshtype,in);
                                  __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                              tao::pegtl::parse_error::~parse_error);
                                }
                                pcVar4 = strdup("rectangular");
                                segment->meshtype = pcVar4;
                                std::__cxx11::string::string
                                          ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p,
                                           (allocator *)&local_58);
                                fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                                segment->origin[1] = fVar9;
                                std::__cxx11::string::~string((string *)&meshtype);
                                ppVar7 = f->_state;
                                ppVar7->found_ybase = true;
                              }
                              else {
                                bVar2 = std::operator==(&f->_state->keyword,"zbase");
                                if (bVar2) {
                                  std::__cxx11::string::string
                                            ((string *)&meshtype,segment->meshtype,
                                             (allocator *)&local_58);
                                  bVar2 = std::operator!=(&meshtype,"rectangular");
                                  std::__cxx11::string::~string((string *)&meshtype);
                                  if (bVar2) {
                                    ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                    fmt::v5::format<char[56],char*>
                                              (&meshtype,
                                               (v5 *)
                                               "zbase is only for rectangular meshes! Mesh type is \"{}\""
                                               ,(char (*) [56])&segment->meshtype,(char **)in_RCX);
                                    tao::pegtl::parse_error::
                                    parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                              (ppVar5,&meshtype,in);
                                    __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                                tao::pegtl::parse_error::~parse_error);
                                  }
                                  pcVar4 = strdup("rectangular");
                                  segment->meshtype = pcVar4;
                                  std::__cxx11::string::string
                                            ((string *)&meshtype,(f->_state->value)._M_dataplus._M_p
                                             ,(allocator *)&local_58);
                                  fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                                  segment->origin[2] = fVar9;
                                  std::__cxx11::string::~string((string *)&meshtype);
                                  ppVar7 = f->_state;
                                  ppVar7->found_zbase = true;
                                }
                                else {
                                  bVar2 = std::operator==(&f->_state->keyword,"xstepsize");
                                  if (bVar2) {
                                    std::__cxx11::string::string
                                              ((string *)&meshtype,segment->meshtype,
                                               (allocator *)&local_58);
                                    bVar2 = std::operator!=(&meshtype,"rectangular");
                                    std::__cxx11::string::~string((string *)&meshtype);
                                    if (bVar2) {
                                      ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                      fmt::v5::format<char[60],char*>
                                                (&meshtype,
                                                 (v5 *)
                                                 "xstepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                 ,(char (*) [60])&segment->meshtype,(char **)in_RCX)
                                      ;
                                      tao::pegtl::parse_error::
                                      parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                (ppVar5,&meshtype,in);
                                      __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                                  tao::pegtl::parse_error::~parse_error);
                                    }
                                    pcVar4 = strdup("rectangular");
                                    segment->meshtype = pcVar4;
                                    std::__cxx11::string::string
                                              ((string *)&meshtype,
                                               (f->_state->value)._M_dataplus._M_p,
                                               (allocator *)&local_58);
                                    fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                                    segment->step_size[0] = fVar9;
                                    std::__cxx11::string::~string((string *)&meshtype);
                                    ppVar7 = f->_state;
                                    ppVar7->found_xstepsize = true;
                                  }
                                  else {
                                    bVar2 = std::operator==(&f->_state->keyword,"ystepsize");
                                    if (bVar2) {
                                      std::__cxx11::string::string
                                                ((string *)&meshtype,segment->meshtype,
                                                 (allocator *)&local_58);
                                      bVar2 = std::operator!=(&meshtype,"rectangular");
                                      std::__cxx11::string::~string((string *)&meshtype);
                                      if (bVar2) {
                                        ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                        fmt::v5::format<char[60],char*>
                                                  (&meshtype,
                                                   (v5 *)
                                                  "ystepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [60])&segment->meshtype,(char **)in_RCX
                                                  );
                                        tao::pegtl::parse_error::
                                        parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                  (ppVar5,&meshtype,in);
                                        __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                                    tao::pegtl::parse_error::~parse_error);
                                      }
                                      pcVar4 = strdup("rectangular");
                                      segment->meshtype = pcVar4;
                                      std::__cxx11::string::string
                                                ((string *)&meshtype,
                                                 (f->_state->value)._M_dataplus._M_p,
                                                 (allocator *)&local_58);
                                      fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                                      segment->step_size[1] = fVar9;
                                      std::__cxx11::string::~string((string *)&meshtype);
                                      ppVar7 = f->_state;
                                      ppVar7->found_ystepsize = true;
                                    }
                                    else {
                                      bVar2 = std::operator==(&f->_state->keyword,"zstepsize");
                                      if (bVar2) {
                                        std::__cxx11::string::string
                                                  ((string *)&meshtype,segment->meshtype,
                                                   (allocator *)&local_58);
                                        bVar2 = std::operator!=(&meshtype,"rectangular");
                                        std::__cxx11::string::~string((string *)&meshtype);
                                        if (bVar2) {
                                          ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                          fmt::v5::format<char[60],char*>
                                                    (&meshtype,
                                                     (v5 *)
                                                  "zstepsize is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [60])&segment->meshtype,(char **)in_RCX
                                                  );
                                          tao::pegtl::parse_error::
                                          parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                    (ppVar5,&meshtype,in);
                                          __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                                      tao::pegtl::parse_error::~parse_error);
                                        }
                                        pcVar4 = strdup("rectangular");
                                        segment->meshtype = pcVar4;
                                        std::__cxx11::string::string
                                                  ((string *)&meshtype,
                                                   (f->_state->value)._M_dataplus._M_p,
                                                   (allocator *)&local_58);
                                        fVar9 = std::__cxx11::stof(&meshtype,(size_t *)0x0);
                                        segment->step_size[2] = fVar9;
                                        std::__cxx11::string::~string((string *)&meshtype);
                                        ppVar7 = f->_state;
                                        ppVar7->found_zstepsize = true;
                                      }
                                      else {
                                        bVar2 = std::operator==(&f->_state->keyword,"xnodes");
                                        if (bVar2) {
                                          std::__cxx11::string::string
                                                    ((string *)&meshtype,segment->meshtype,
                                                     (allocator *)&local_58);
                                          bVar2 = std::operator!=(&meshtype,"rectangular");
                                          std::__cxx11::string::~string((string *)&meshtype);
                                          if (bVar2) {
                                            ppVar5 = (parse_error *)__cxa_allocate_exception(0x28);
                                            fmt::v5::format<char[57],char*>
                                                      (&meshtype,
                                                       (v5 *)
                                                  "xnodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&segment->meshtype,(char **)in_RCX
                                                  );
                                            tao::pegtl::parse_error::
                                            parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                      (ppVar5,&meshtype,in);
                                            __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                                        tao::pegtl::parse_error::~parse_error);
                                          }
                                          pcVar4 = strdup("rectangular");
                                          segment->meshtype = pcVar4;
                                          std::__cxx11::string::string
                                                    ((string *)&meshtype,
                                                     (f->_state->value)._M_dataplus._M_p,
                                                     (allocator *)&local_58);
                                          iVar3 = std::__cxx11::stoi(&meshtype,(size_t *)0x0,10);
                                          segment->n_cells[0] = iVar3;
                                          std::__cxx11::string::~string((string *)&meshtype);
                                          ppVar7 = f->_state;
                                          ppVar7->found_xnodes = true;
                                        }
                                        else {
                                          bVar2 = std::operator==(&f->_state->keyword,"ynodes");
                                          if (bVar2) {
                                            std::__cxx11::string::string
                                                      ((string *)&meshtype,segment->meshtype,
                                                       (allocator *)&local_58);
                                            bVar2 = std::operator!=(&meshtype,"rectangular");
                                            std::__cxx11::string::~string((string *)&meshtype);
                                            if (bVar2) {
                                              ppVar5 = (parse_error *)__cxa_allocate_exception(0x28)
                                              ;
                                              fmt::v5::format<char[57],char*>
                                                        (&meshtype,
                                                         (v5 *)
                                                  "ynodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&segment->meshtype,(char **)in_RCX
                                                  );
                                              tao::pegtl::parse_error::
                                              parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                        (ppVar5,&meshtype,in);
                                              __cxa_throw(ppVar5,&tao::pegtl::parse_error::typeinfo,
                                                          tao::pegtl::parse_error::~parse_error);
                                            }
                                            pcVar4 = strdup("rectangular");
                                            segment->meshtype = pcVar4;
                                            std::__cxx11::string::string
                                                      ((string *)&meshtype,
                                                       (f->_state->value)._M_dataplus._M_p,
                                                       (allocator *)&local_58);
                                            iVar3 = std::__cxx11::stoi(&meshtype,(size_t *)0x0,10);
                                            segment->n_cells[1] = iVar3;
                                            std::__cxx11::string::~string((string *)&meshtype);
                                            ppVar7 = f->_state;
                                            ppVar7->found_ynodes = true;
                                          }
                                          else {
                                            bVar2 = std::operator==(&f->_state->keyword,"znodes");
                                            if (bVar2) {
                                              std::__cxx11::string::string
                                                        ((string *)&meshtype,segment->meshtype,
                                                         (allocator *)&local_58);
                                              bVar2 = std::operator!=(&meshtype,"rectangular");
                                              std::__cxx11::string::~string((string *)&meshtype);
                                              if (bVar2) {
                                                ppVar5 = (parse_error *)
                                                         __cxa_allocate_exception(0x28);
                                                fmt::v5::format<char[57],char*>
                                                          (&meshtype,
                                                           (v5 *)
                                                  "znodes is only for rectangular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [57])&segment->meshtype,(char **)in_RCX
                                                  );
                                                tao::pegtl::parse_error::
                                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                          (ppVar5,&meshtype,in);
                                                __cxa_throw(ppVar5,&tao::pegtl::parse_error::
                                                                    typeinfo,
                                                            tao::pegtl::parse_error::~parse_error);
                                              }
                                              pcVar4 = strdup("rectangular");
                                              segment->meshtype = pcVar4;
                                              std::__cxx11::string::string
                                                        ((string *)&meshtype,
                                                         (f->_state->value)._M_dataplus._M_p,
                                                         (allocator *)&local_58);
                                              iVar3 = std::__cxx11::stoi(&meshtype,(size_t *)0x0,10)
                                              ;
                                              segment->n_cells[2] = iVar3;
                                              std::__cxx11::string::~string((string *)&meshtype);
                                              ppVar7 = f->_state;
                                              ppVar7->found_znodes = true;
                                            }
                                            else {
                                              bVar2 = std::operator==(&f->_state->keyword,
                                                                      "pointcount");
                                              if (!bVar2) {
                                                ppVar5 = (parse_error *)
                                                         __cxa_allocate_exception(0x28);
                                                fmt::v5::
                                                format<char[27],std::__cxx11::string,std::__cxx11::string>
                                                          (&meshtype,
                                                           (v5 *)"unknown keyword \"{}\": \"{}\"",
                                                           (char (*) [27])&f->_state->keyword,
                                                           &f->_state->value,in_R8);
                                                tao::pegtl::parse_error::
                                                parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                          (ppVar5,&meshtype,in);
                                                __cxa_throw(ppVar5,&tao::pegtl::parse_error::
                                                                    typeinfo,
                                                            tao::pegtl::parse_error::~parse_error);
                                              }
                                              std::__cxx11::string::string
                                                        ((string *)&meshtype,segment->meshtype,
                                                         &local_59);
                                              ppcVar8 = &segment->meshtype;
                                              bVar2 = std::operator!=(&meshtype,"");
                                              if (bVar2) {
                                                std::__cxx11::string::string
                                                          ((string *)&local_58,*ppcVar8,&local_31);
                                                bVar2 = std::operator!=(&local_58,"irregular");
                                                std::__cxx11::string::~string((string *)&local_58);
                                                std::__cxx11::string::~string((string *)&meshtype);
                                                if (bVar2) {
                                                  ppVar5 = (parse_error *)
                                                           __cxa_allocate_exception(0x28);
                                                  fmt::v5::format<char[59],char*>
                                                            (&meshtype,
                                                             (v5 *)
                                                  "pointcount is only for irregular meshes! Mesh type is \"{}\""
                                                  ,(char (*) [59])ppcVar8,(char **)in_RCX);
                                                  tao::pegtl::parse_error::
                                                  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
                                                            (ppVar5,&meshtype,in);
                                                  __cxa_throw(ppVar5,&tao::pegtl::parse_error::
                                                                      typeinfo,
                                                              tao::pegtl::parse_error::~parse_error)
                                                  ;
                                                }
                                              }
                                              else {
                                                std::__cxx11::string::~string((string *)&meshtype);
                                              }
                                              pcVar4 = strdup("irregular");
                                              *ppcVar8 = pcVar4;
                                              std::__cxx11::string::string
                                                        ((string *)&meshtype,
                                                         (f->_state->value)._M_dataplus._M_p,
                                                         (allocator *)&local_58);
                                              iVar3 = std::__cxx11::stoi(&meshtype,(size_t *)0x0,10)
                                              ;
                                              segment->pointcount = iVar3;
                                              std::__cxx11::string::~string((string *)&meshtype);
                                              ppVar7 = f->_state;
                                              ppVar7->found_pointcount = true;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::assign((char *)&ppVar7->keyword);
  std::__cxx11::string::assign((char *)&f->_state->value);
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, ovf_segment & segment )
            {
                if( f._state->keyword == "title" )
                {
                    segment.title = strdup(f._state->value.c_str());
                    f._state->found_title = true;
                }
                else if( f._state->keyword == "desc" )
                    segment.comment = strdup(f._state->value.c_str());
                else if( f._state->keyword == "meshunit" )
                {
                    segment.meshunit = strdup(f._state->value.c_str());
                    f._state->found_meshunit = true;
                }
                else if( f._state->keyword == "valuedim" )
                {
                    segment.valuedim = std::stoi(f._state->value.c_str());
                    f._state->found_valuedim = true;
                }
                else if( f._state->keyword == "valueunits" )
                {
                    segment.valueunits = strdup(f._state->value.c_str());
                    f._state->found_valueunits = true;
                }
                else if( f._state->keyword == "valuelabels" )
                {
                    segment.valuelabels = strdup(f._state->value.c_str());
                    f._state->found_valuelabels = true;
                }
                else if( f._state->keyword == "xmin" )
                {
                    segment.bounds_min[0] = std::stof(f._state->value.c_str());
                    f._state->found_xmin = true;
                }
                else if( f._state->keyword == "ymin" )
                {
                    segment.bounds_min[1] = std::stof(f._state->value.c_str());
                    f._state->found_ymin = true;
                }
                else if( f._state->keyword == "zmin" )
                {
                    segment.bounds_min[2] = std::stof(f._state->value.c_str());
                    f._state->found_zmin = true;
                }
                else if( f._state->keyword == "xmax" )
                {
                    segment.bounds_max[0] = std::stof(f._state->value.c_str());
                    f._state->found_xmax = true;
                }
                else if( f._state->keyword == "ymax" )
                {
                    segment.bounds_max[1] = std::stof(f._state->value.c_str());
                    f._state->found_ymax = true;
                }
                else if( f._state->keyword == "zmax" )
                {
                    segment.bounds_max[2] = std::stof(f._state->value.c_str());
                    f._state->found_zmax = true;
                }
                else if( f._state->keyword == "meshtype" )
                {
                    std::string meshtype = f._state->value;
                    std::transform(meshtype.begin(), meshtype.end(), meshtype.begin(), ::tolower);
                    if( std::string(segment.meshtype) == "" )
                    {
                        if( meshtype != "rectangular" && meshtype != "irregular" )
                            throw tao::pegtl::parse_error( fmt::format(
                                "Invalid meshtype: \"{}\"", meshtype), in );
                        segment.meshtype = strdup(meshtype.c_str());
                    }
                    else if( std::string(segment.meshtype) != meshtype )
                    {
                        throw tao::pegtl::parse_error( fmt::format(
                            "meshtype \"{}\" was specified, but due to other parameters specified before, \"{}\" was expected!",
                            meshtype, segment.meshtype), in );
                    }
                    f._state->found_meshtype = true;
                }
                else if( f._state->keyword == "xbase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xbase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[0] = std::stof(f._state->value.c_str());
                    f._state->found_xbase = true;
                }
                else if( f._state->keyword == "ybase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ybase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[1] = std::stof(f._state->value.c_str());
                    f._state->found_ybase = true;
                }
                else if( f._state->keyword == "zbase" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "zbase is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.origin[2] = std::stof(f._state->value.c_str());
                    f._state->found_zbase = true;
                }
                else if( f._state->keyword == "xstepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xstepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[0] = std::stof(f._state->value.c_str());
                    f._state->found_xstepsize = true;
                }
                else if( f._state->keyword == "ystepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ystepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[1] = std::stof(f._state->value.c_str());
                    f._state->found_ystepsize = true;
                }
                else if( f._state->keyword == "zstepsize" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "zstepsize is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.step_size[2] = std::stof(f._state->value.c_str());
                    f._state->found_zstepsize = true;
                }
                else if( f._state->keyword == "xnodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "xnodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[0] = std::stoi(f._state->value.c_str());
                    f._state->found_xnodes = true;
                }
                else if( f._state->keyword == "ynodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "ynodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[1] = std::stoi(f._state->value.c_str());
                    f._state->found_ynodes = true;
                }
                else if( f._state->keyword == "znodes" )
                {
                    if( std::string(segment.meshtype) != "rectangular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "znodes is only for rectangular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("rectangular");
                    segment.n_cells[2] = std::stoi(f._state->value.c_str());
                    f._state->found_znodes = true;
                }
                else if( f._state->keyword == "pointcount" )
                {
                    if( std::string(segment.meshtype) != "" && std::string(segment.meshtype) != "irregular" )
                        throw tao::pegtl::parse_error( fmt::format(
                            "pointcount is only for irregular meshes! Mesh type is \"{}\"", segment.meshtype), in );
                    segment.meshtype = strdup("irregular");
                    segment.pointcount = std::stoi(f._state->value.c_str());
                    f._state->found_pointcount = true;
                }
                else
                {
                    // UNKNOWN KEYWORD
                    throw tao::pegtl::parse_error( fmt::format(
                        "unknown keyword \"{}\": \"{}\"", f._state->keyword, f._state->value), in );
                }

                f._state->keyword = "";
                f._state->value = "";
            }